

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.h
# Opt level: O2

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
::matches(Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          *this,candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_>
                candidate)

{
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar1;
  bool bVar2;
  
  if (candidate->_id == UnaryId) {
    if (this->binder !=
        (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_> *)0x0) {
      *this->binder =
           (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_>)
           candidate;
    }
    if (candidate[1]._id == this->data) {
      ppEVar1 = ((this->submatchers).curr)->binder;
      bVar2 = true;
      if (ppEVar1 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        *ppEVar1 = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)
                   candidate[1].type.id;
      }
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

T* dynCast() {
    static_assert(std::is_base_of<Expression, T>::value,
                  "Expression is not a base of destination type T");
    return int(_id) == int(T::SpecificId) ? (T*)this : nullptr;
  }